

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::SparseContext::SparseContext
          (SparseContext *this,Context *context)

{
  VkDevice_s *pVVar1;
  DestroyDeviceFunc p_Var2;
  VkAllocationCallbacks *pVVar3;
  InstanceInterface *pIVar4;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *pIVar5;
  VkQueue pVVar6;
  Allocator *pAVar7;
  NotSupportedError *this_00;
  pointer pVVar8;
  bool bVar9;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_58;
  Move<vk::VkDevice_s_*> local_38;
  
  this->m_context = context;
  pIVar4 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceQueueFamilyProperties(&local_58,pIVar4,physicalDevice);
  bVar9 = (long)local_58.
                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58.
                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                ._M_impl.super__Vector_impl_data._M_start != 0;
  if (bVar9) {
    pIVar5 = (InstanceInterface *)
             (((long)local_58.
                     super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58.
                     super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    if ((~(local_58.
           super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
           ._M_impl.super__Vector_impl_data._M_start)->queueFlags & 9) == 0) {
      pIVar4 = (InstanceInterface *)0x0;
      bVar9 = true;
    }
    else {
      pIVar4 = (InstanceInterface *)0x0;
      pVVar8 = local_58.
               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pVVar8 = pVVar8 + 1;
        if ((InstanceInterface *)((long)pIVar5 + ((ulong)(pIVar5 == (InstanceInterface *)0x0) - 1))
            == pIVar4) {
          pIVar4 = (InstanceInterface *)((long)&pIVar4->_vptr_InstanceInterface + 1);
          bVar9 = pIVar4 < pIVar5;
          goto LAB_00646597;
        }
        pIVar4 = (InstanceInterface *)((long)&pIVar4->_vptr_InstanceInterface + 1);
      } while ((~pVVar8->queueFlags & 9) != 0);
      bVar9 = pIVar4 < pIVar5;
    }
  }
LAB_00646597:
  if (bVar9) {
    if (local_58.
        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    this->m_queueFamilyIndex = (deUint32)pIVar4;
    createDevice(&local_38,this);
    pVVar3 = local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
    p_Var2 = local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
    pVVar1 = local_38.super_RefBase<vk::VkDevice_s_*>.m_data.object;
    local_58.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
    local_58.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_38.super_RefBase<vk::VkDevice_s_*>.m_data.object;
    local_58.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
    local_38.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
    local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0
    ;
    local_38.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator = pVVar3;
    (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object = pVVar1;
    (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = p_Var2;
    pIVar4 = Context::getInstanceInterface(context);
    ::vk::DeviceDriver::DeviceDriver
              (&this->m_deviceInterface,pIVar4,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object);
    pVVar6 = ::vk::getDeviceQueue
                       (&(this->m_deviceInterface).super_DeviceInterface,
                        (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                        this->m_queueFamilyIndex,0);
    this->m_queue = pVVar6;
    pAVar7 = createAllocator(this);
    (this->m_allocator).super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.
    ptr = pAVar7;
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"No matching queue found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
             ,0x26e);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderRenderCaseInstance::SparseContext::SparseContext (vkt::Context& context)
	: m_context				(context)
	, m_queueFamilyIndex	(findQueueFamilyIndexWithCaps(context.getInstanceInterface(), context.getPhysicalDevice(), VK_QUEUE_GRAPHICS_BIT|VK_QUEUE_SPARSE_BINDING_BIT))
	, m_device				(createDevice())
	, m_deviceInterface		(context.getInstanceInterface(), *m_device)
	, m_queue				(getDeviceQueue(m_deviceInterface, *m_device, m_queueFamilyIndex, 0))
	, m_allocator			(createAllocator())
{
}